

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void bhdct_setup(planck_unit_test_t *tc,ion_dictionary_handler_t *handler,ion_dictionary_t *dict,
                ion_behaviour_fill_level_e fill_level)

{
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  ion_behaviour_fill_level_e local_24;
  int i;
  ion_behaviour_fill_level_e fill_level_local;
  ion_dictionary_t *dict_local;
  ion_dictionary_handler_t *handler_local;
  planck_unit_test_t *tc_local;
  
  local_24 = fill_level;
  _i = dict;
  dict_local = (ion_dictionary_t *)handler;
  handler_local = (ion_dictionary_handler_t *)tc;
  bhdct_master_table_init(tc);
  (*bhdct_context.init_fcn)((ion_dictionary_handler_t *)dict_local);
  bhdct_dictionary_initialization
            ((planck_unit_test_t *)handler_local,(ion_dictionary_handler_t *)dict_local,_i,
             key_type_numeric_signed,4,4,bhdct_context.dictionary_size);
  switch(local_24) {
  case ion_fill_none:
    return;
  case ion_fill_edge_cases:
    for (local_28 = -100; local_28 < -0x32; local_28 = local_28 + 2) {
      local_2c = local_28;
      local_30 = local_28 * 3;
      bhdct_insert((planck_unit_test_t *)handler_local,_i,&local_2c,&local_30,'\x01');
    }
  case ion_fill_high:
    for (local_28 = 500; local_28 < 1000; local_28 = local_28 + 5) {
      local_34 = local_28;
      local_38 = local_28 * 10;
      bhdct_insert((planck_unit_test_t *)handler_local,_i,&local_34,&local_38,'\x01');
    }
  case ion_fill_medium:
    for (local_28 = 0x32; local_28 < 100; local_28 = local_28 + 2) {
      local_3c = local_28;
      local_40 = local_28 * 5;
      bhdct_insert((planck_unit_test_t *)handler_local,_i,&local_3c,&local_40,'\x01');
    }
  case ion_fill_low:
    for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
      local_44 = local_28;
      local_48 = local_28 << 1;
      bhdct_insert((planck_unit_test_t *)handler_local,_i,&local_44,&local_48,'\x01');
    }
    return;
  default:
    return;
  }
}

Assistant:

void
bhdct_setup(
	planck_unit_test_t			*tc,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dict,
	ion_behaviour_fill_level_e	fill_level
) {
	bhdct_master_table_init(tc);
	bhdct_context.init_fcn(handler);
	/* Note most of these are fixed except the dictionary size */
	bhdct_dictionary_initialization(tc, handler, dict, key_type_numeric_signed, sizeof(int), sizeof(int), bhdct_context.dictionary_size);

	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_EDGE_VALUE(i), boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_HIGH_VALUE(i), boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_MEDIUM_VALUE(i), boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_LOW_VALUE(i), boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}